

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall kj::WebSocket::pumpTo(WebSocket *this,WebSocket *other)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  SourceLocation location_00;
  OwnPromiseNode OVar2;
  void *pvVar3;
  WebSocket *in_RDX;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:3802:53)>
  *location_01;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:3802:53),_void>
  cancelPromise;
  NullableValue<kj::Promise<void>_> _p3796;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  NullableValue<kj::Exception> _e1576;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_550;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_548;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_540;
  NullableValue<kj::Promise<void>_> local_538;
  char *local_528;
  char *pcStack_520;
  undefined8 local_518;
  anon_class_8_1_8991fb9c_for_func local_510;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_508;
  code *local_500;
  OwnPromiseNode local_4f8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_4f0 [50];
  NullableValue<kj::Exception> local_360;
  NullableValue<kj::Exception> local_1c8;
  
  (*in_RDX->_vptr_WebSocket[8])(&local_1c8);
  local_538.isSet = local_1c8.isSet;
  if (local_1c8.isSet == true) {
    local_538.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)
         local_1c8.field_1.value.ownFile.content.ptr;
    local_1c8.field_1.value.ownFile.content.ptr = (char *)0x0;
  }
  kj::_::NullableValue<kj::Promise<void>_>::~NullableValue
            ((NullableValue<kj::Promise<void>_> *)&local_1c8);
  if (local_538.isSet == true) {
    this->_vptr_WebSocket = (_func_int **)local_538.field_1;
    local_538.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
  }
  else {
    this->_vptr_WebSocket = (_func_int **)0x0;
    (*in_RDX->_vptr_WebSocket[5])(&local_550);
    local_500 = kj::_::
                SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3802:53)>
                ::anon_class_8_1_8991fb9c_for_func::operator();
    pPVar1 = ((local_550.ptr)->super_PromiseArenaMember).arena;
    local_510.this = other;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_550.ptr - (long)pPVar1) < 0x28) {
      pvVar3 = operator_new(0x400);
      location_01 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:3802:53)>
                     *)((long)pvVar3 + 0x3d8);
      kj::operator()(location_01,&local_550,&local_510,&local_500);
      *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
    }
    else {
      ((local_550.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      location_01 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:3802:53)>
                     *)&local_550.ptr[-3].super_PromiseArenaMember.arena;
      kj::operator()(location_01,&local_550,&local_510,&local_500);
      local_550.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
    }
    local_528 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
    ;
    pcStack_520 = "then";
    local_518 = 0x4c0000058b;
    location.function = &DAT_0042a1d1;
    location.fileName = &DAT_0042a172;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    local_508.ptr = (PromiseNode *)location_01;
    kj::_::maybeChain<void>(&local_4f8,(Promise<void> *)&local_508,location);
    OVar2.ptr = local_4f8.ptr;
    local_4f8.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_4f8);
    local_540.ptr = OVar2.ptr;
    local_4f0[0].ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(local_4f0);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_508);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_550);
    pumpWebSocketLoop((kj *)local_4f0,other,in_RDX);
    local_528 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    pcStack_520 = "operator()";
    local_518 = 0xe00000edf;
    location_00.function = "operator()";
    location_00.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    location_00.lineNumber = 0xedf;
    location_00.columnNumber = 0xe;
    Promise<void>::exclusiveJoin((Promise<void> *)&local_548,(Promise<void> *)local_4f0,location_00)
    ;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(local_4f0);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_540);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this,&local_548);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_548);
    local_360.isSet = false;
    kj::_::NullableValue<kj::Exception>::NullableValue(&local_1c8,&local_360);
    kj::_::NullableValue<kj::Exception>::~NullableValue(&local_360);
    if (local_1c8.isSet == true) {
      Promise<void>::Promise((Promise<void> *)&local_360,&local_1c8.field_1.value);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this,
                 (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_360);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_360);
    }
    kj::_::NullableValue<kj::Exception>::~NullableValue(&local_1c8);
  }
  kj::_::NullableValue<kj::Promise<void>_>::~NullableValue(&local_538);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> WebSocket::pumpTo(WebSocket& other) {
  KJ_IF_SOME(p, other.tryPumpFrom(*this)) {
    // Yay, optimized pump!
    return kj::mv(p);
  } else {
    // Fall back to default implementation.
    return kj::evalNow([&]() {
      auto cancelPromise = other.whenAborted().then([this]() -> kj::Promise<void> {
        this->abort();
        return KJ_EXCEPTION(DISCONNECTED,
            "destination of WebSocket pump disconnected prematurely");
      });
      return pumpWebSocketLoop(*this, other).exclusiveJoin(kj::mv(cancelPromise));
    });
  }
}